

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::GroupNorm_x86_avx::forward_inplace(GroupNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  float *pfVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [32];
  float *pfVar28;
  long lVar29;
  uint uVar30;
  undefined1 (*pauVar31) [32];
  long lVar32;
  float *pfVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  __m128 x64;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar97 [16];
  undefined1 auVar106 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar107 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar145 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar158 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar159 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [64];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar174 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  
  auVar16 = _DAT_005a6960;
  auVar15 = _DAT_005a6940;
  iVar21 = bottom_top_blob->dims;
  iVar24 = (this->super_GroupNorm).group;
  uVar34 = (long)(this->super_GroupNorm).channels / (long)iVar24;
  uVar37 = uVar34 & 0xffffffff;
  uVar19 = (uint)uVar34;
  auVar123 = in_ZMM6._0_16_;
  if (iVar21 == 2) {
    if (0 < iVar24) {
      uVar20 = bottom_top_blob->w;
      uVar30 = uVar20 * uVar19;
      uVar22 = uVar30 & 0xfffffff8;
      lVar29 = 0;
      auVar48._8_8_ = 0x8000000000000000;
      auVar48._0_8_ = 0x8000000000000000;
      auVar123 = vpcmpeqd_avx(auVar123,auVar123);
      do {
        lVar32 = lVar29 * (int)uVar19;
        pauVar31 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar32 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar147 = 0.0;
        fVar148 = 0.0;
        fVar138 = 0.0;
        fVar146 = 0.0;
        fVar149 = 0.0;
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar152 = 0.0;
        pauVar27 = pauVar31;
        uVar36 = 0;
        fVar160 = 0.0;
        fVar161 = 0.0;
        fVar162 = 0.0;
        fVar163 = 0.0;
        fVar164 = 0.0;
        fVar165 = 0.0;
        fVar166 = 0.0;
        fVar157 = 0.0;
        if (7 < (int)uVar30) {
          iVar21 = 7;
          do {
            fVar138 = fVar138 + *(float *)*pauVar27;
            fVar146 = fVar146 + *(float *)(*pauVar27 + 4);
            fVar147 = fVar147 + *(float *)(*pauVar27 + 8);
            fVar148 = fVar148 + *(float *)(*pauVar27 + 0xc);
            fVar149 = fVar149 + *(float *)(*pauVar27 + 0x10);
            fVar150 = fVar150 + *(float *)(*pauVar27 + 0x14);
            fVar151 = fVar151 + *(float *)(*pauVar27 + 0x18);
            fVar152 = fVar152 + *(float *)(*pauVar27 + 0x1c);
            pauVar27 = pauVar27 + 1;
            iVar21 = iVar21 + 8;
            uVar36 = uVar22;
            fVar160 = fVar138;
            fVar161 = fVar146;
            fVar162 = fVar147;
            fVar163 = fVar148;
            fVar164 = fVar149;
            fVar165 = fVar150;
            fVar166 = fVar151;
            fVar157 = fVar152;
          } while (iVar21 < (int)uVar30);
        }
        uVar23 = uVar36 | 3;
        auVar60 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar147 = auVar60._4_4_;
          fVar148 = auVar60._8_4_;
          fVar138 = auVar60._12_4_;
          if ((int)uVar30 <= (int)uVar23) break;
          auVar60._0_4_ = auVar60._0_4_ + *(float *)*pauVar27;
          auVar60._4_4_ = fVar147 + *(float *)(*pauVar27 + 4);
          auVar60._8_4_ = fVar148 + *(float *)(*pauVar27 + 8);
          auVar60._12_4_ = fVar138 + *(float *)(*pauVar27 + 0xc);
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          uVar23 = uVar36 + 7;
          uVar36 = uVar36 + 4;
        }
        auVar52._0_4_ = fVar160 + fVar164;
        auVar52._4_4_ = fVar161 + fVar165;
        auVar52._8_4_ = fVar162 + fVar166;
        auVar52._12_4_ = fVar163 + fVar157;
        auVar54 = vshufpd_avx(auVar52,auVar52,1);
        auVar53._0_4_ = auVar54._0_4_ + auVar52._0_4_;
        auVar53._4_4_ = auVar54._4_4_ + auVar52._4_4_;
        auVar53._8_4_ = auVar54._8_4_ + auVar52._8_4_;
        auVar53._12_4_ = auVar54._12_4_ + auVar52._12_4_;
        auVar54 = vshufpd_avx(auVar60,auVar60,1);
        auVar112._0_4_ = auVar60._0_4_ + auVar54._0_4_;
        auVar112._4_4_ = fVar147 + auVar54._4_4_;
        auVar112._8_4_ = fVar148 + auVar54._8_4_;
        auVar112._12_4_ = fVar138 + auVar54._12_4_;
        auVar60 = vhaddps_avx(auVar53,auVar53);
        auVar54 = vmovshdup_avx(auVar112);
        fVar147 = auVar60._0_4_ + auVar54._0_4_ + auVar112._0_4_;
        if ((int)uVar36 < (int)uVar30) {
          uVar34 = CONCAT44(0,~uVar36 + uVar30);
          auVar60 = vblendps_avx(ZEXT416((uint)fVar147),_DAT_005a5060,0xe);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = uVar34;
          auVar53 = vpshufd_avx(auVar54,0x44);
          auVar54 = vorps_avx(auVar53,auVar48);
          auVar52 = vorps_avx(auVar53,auVar48);
          uVar37 = 0;
          auVar195 = ZEXT1664(auVar60);
          do {
            auVar145 = auVar195;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = uVar37;
            auVar60 = vpshufd_avx(auVar55,0x44);
            auVar83._16_16_ = auVar60;
            auVar83._0_16_ = auVar60;
            auVar84 = vorps_avx(auVar83,auVar15);
            auVar83 = vorps_avx(auVar83,auVar16);
            auVar60 = vorps_avx(auVar53,auVar48);
            auVar129._8_4_ = auVar83._24_4_;
            auVar129._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
            auVar129._12_4_ = auVar83._28_4_ ^ 0x80000000;
            auVar55 = vpcmpgtq_avx(auVar129,auVar60);
            auVar113._8_4_ = auVar83._8_4_;
            auVar177._8_4_ = auVar113._8_4_;
            auVar177._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
            auVar177._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar177,auVar54);
            auVar112 = vpackssdw_avx(auVar112,auVar55);
            auVar185._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
            auVar185._8_4_ = auVar84._24_4_;
            auVar185._12_4_ = auVar84._28_4_ ^ 0x80000000;
            auVar129 = vpcmpgtq_avx(auVar185,auVar60);
            auVar186._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
            auVar186._8_4_ = auVar84._8_4_;
            auVar186._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar60 = vpcmpgtq_avx(auVar186,auVar52);
            auVar60 = vpackssdw_avx(auVar60,auVar129);
            auVar60 = vpackssdw_avx(auVar60 ^ auVar123,auVar112 ^ auVar123);
            auVar112 = vpmovsxwd_avx(auVar60);
            auVar60 = vpunpckhwd_avx(auVar60,auVar60);
            auVar181._16_16_ = auVar60;
            auVar181._0_16_ = auVar112;
            auVar181 = vmaskmovps_avx(auVar181,*(undefined1 (*) [32])(*pauVar27 + uVar37 * 4));
            auVar140._0_4_ = auVar181._0_4_ + auVar145._0_4_;
            auVar140._4_4_ = auVar181._4_4_ + auVar145._4_4_;
            auVar140._8_4_ = auVar181._8_4_ + auVar145._8_4_;
            auVar140._12_4_ = auVar181._12_4_ + auVar145._12_4_;
            auVar143._16_4_ = auVar181._16_4_ + auVar145._16_4_;
            auVar143._0_16_ = auVar140;
            auVar143._20_4_ = auVar181._20_4_ + auVar145._20_4_;
            auVar143._24_4_ = auVar181._24_4_ + auVar145._24_4_;
            auVar143._28_4_ = auVar181._28_4_ + auVar145._28_4_;
            uVar37 = uVar37 + 8;
            auVar195 = ZEXT3264(auVar143);
          } while ((uVar34 + 8 & 0x1fffffff8) != uVar37);
          auVar60 = vorps_avx(auVar53,auVar48);
          auVar113._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
          auVar113._12_4_ = auVar83._12_4_ ^ 0x80000000;
          auVar60 = vpcmpgtq_avx(auVar113,auVar60);
          auVar54 = vpackssdw_avx(auVar60,auVar55);
          auVar60 = vorps_avx(auVar53,auVar48);
          auVar155._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
          auVar155._8_4_ = auVar84._8_4_;
          auVar155._12_4_ = auVar84._12_4_ ^ 0x80000000;
          auVar60 = vpcmpgtq_avx(auVar155,auVar60);
          auVar60 = vpackssdw_avx(auVar60,auVar129);
          auVar60 = vblendvps_avx(auVar145._0_16_,auVar140,auVar60 ^ auVar123);
          auVar54 = vblendvps_avx(auVar145._16_16_,auVar143._16_16_,auVar54 ^ auVar123);
          auVar60 = vhaddps_avx(auVar54,auVar60);
          auVar60 = vhaddps_avx(auVar60,auVar60);
          auVar60 = vhaddps_avx(auVar60,auVar60);
          fVar147 = auVar60._0_4_;
        }
        fVar147 = (1.0 / (float)(int)uVar30) * fVar147;
        auVar60 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
        pauVar27 = pauVar31;
        if ((int)uVar30 < 8) {
          fVar148 = 0.0;
          fVar160 = 0.0;
          fVar161 = 0.0;
          fVar162 = 0.0;
          fVar163 = 0.0;
          fVar164 = 0.0;
          fVar165 = 0.0;
          fVar166 = 0.0;
          uVar36 = 0;
        }
        else {
          auVar84._16_16_ = auVar60;
          auVar84._0_16_ = auVar60;
          fVar148 = 0.0;
          fVar160 = 0.0;
          fVar161 = 0.0;
          fVar162 = 0.0;
          fVar163 = 0.0;
          fVar164 = 0.0;
          fVar165 = 0.0;
          fVar166 = 0.0;
          iVar21 = 7;
          do {
            auVar83 = vsubps_avx(*pauVar27,auVar84);
            fVar148 = fVar148 + auVar83._0_4_ * auVar83._0_4_;
            fVar160 = fVar160 + auVar83._4_4_ * auVar83._4_4_;
            fVar161 = fVar161 + auVar83._8_4_ * auVar83._8_4_;
            fVar162 = fVar162 + auVar83._12_4_ * auVar83._12_4_;
            fVar163 = fVar163 + auVar83._16_4_ * auVar83._16_4_;
            fVar164 = fVar164 + auVar83._20_4_ * auVar83._20_4_;
            fVar165 = fVar165 + auVar83._24_4_ * auVar83._24_4_;
            fVar166 = fVar166 + auVar83._28_4_;
            pauVar27 = pauVar27 + 1;
            iVar21 = iVar21 + 8;
            uVar36 = uVar22;
          } while (iVar21 < (int)uVar30);
        }
        uVar23 = uVar36 | 3;
        auVar168 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar157 = auVar168._4_4_;
          fVar138 = auVar168._8_4_;
          fVar146 = auVar168._12_4_;
          if ((int)uVar30 <= (int)uVar23) break;
          auVar54 = vsubps_avx(*(undefined1 (*) [16])*pauVar27,auVar60);
          auVar168._0_4_ = auVar168._0_4_ + auVar54._0_4_ * auVar54._0_4_;
          auVar168._4_4_ = fVar157 + auVar54._4_4_ * auVar54._4_4_;
          auVar168._8_4_ = fVar138 + auVar54._8_4_ * auVar54._8_4_;
          auVar168._12_4_ = fVar146 + auVar54._12_4_ * auVar54._12_4_;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          uVar23 = uVar36 + 7;
          uVar36 = uVar36 + 4;
        }
        auVar56._0_4_ = fVar148 + fVar163;
        auVar56._4_4_ = fVar160 + fVar164;
        auVar56._8_4_ = fVar161 + fVar165;
        auVar56._12_4_ = fVar162 + fVar166;
        auVar54 = vshufpd_avx(auVar56,auVar56,1);
        auVar57._0_4_ = auVar54._0_4_ + auVar56._0_4_;
        auVar57._4_4_ = auVar54._4_4_ + auVar56._4_4_;
        auVar57._8_4_ = auVar54._8_4_ + auVar56._8_4_;
        auVar57._12_4_ = auVar54._12_4_ + auVar56._12_4_;
        auVar54 = vshufpd_avx(auVar168,auVar168,1);
        auVar114._0_4_ = auVar168._0_4_ + auVar54._0_4_;
        auVar114._4_4_ = fVar157 + auVar54._4_4_;
        auVar114._8_4_ = fVar138 + auVar54._8_4_;
        auVar114._12_4_ = fVar146 + auVar54._12_4_;
        auVar54 = vhaddps_avx(auVar57,auVar57);
        auVar52 = vmovshdup_avx(auVar114);
        fVar148 = auVar54._0_4_ + auVar52._0_4_ + auVar114._0_4_;
        if ((int)uVar36 < (int)uVar30) {
          uVar34 = CONCAT44(0,~uVar36 + uVar30);
          auVar54 = vblendps_avx(ZEXT416((uint)fVar148),_DAT_005a5060,0xe);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar34;
          auVar53 = vpshufd_avx(auVar58,0x44);
          auVar170._16_16_ = auVar60;
          auVar170._0_16_ = auVar60;
          auVar60 = vorps_avx(auVar53,auVar48);
          auVar52 = vorps_avx(auVar53,auVar48);
          uVar37 = 0;
          auVar195 = ZEXT1664(auVar54);
          do {
            auVar145 = auVar195;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar37;
            auVar54 = vpshufd_avx(auVar59,0x44);
            auVar85._16_16_ = auVar54;
            auVar85._0_16_ = auVar54;
            auVar84 = vorps_avx(auVar85,auVar15);
            auVar83 = vorps_avx(auVar85,auVar16);
            auVar54 = vorps_avx(auVar53,auVar48);
            auVar130._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
            auVar130._8_4_ = auVar83._24_4_;
            auVar130._12_4_ = auVar83._28_4_ ^ 0x80000000;
            auVar55 = vpcmpgtq_avx(auVar130,auVar54);
            auVar191._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
            auVar115._8_4_ = auVar83._8_4_;
            auVar191._8_4_ = auVar115._8_4_;
            auVar191._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar191,auVar60);
            auVar112 = vpackssdw_avx(auVar112,auVar55);
            auVar95._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
            auVar95._8_4_ = auVar84._24_4_;
            auVar95._12_4_ = auVar84._28_4_ ^ 0x80000000;
            auVar129 = vpcmpgtq_avx(auVar95,auVar54);
            auVar96._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
            auVar96._8_4_ = auVar84._8_4_;
            auVar96._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar54 = vpcmpgtq_avx(auVar96,auVar52);
            auVar54 = vpackssdw_avx(auVar54,auVar129);
            auVar54 = vpackssdw_avx(auVar54 ^ auVar123,auVar112 ^ auVar123);
            auVar112 = vpmovsxwd_avx(auVar54);
            auVar54 = vpunpckhwd_avx(auVar54,auVar54);
            auVar103._16_16_ = auVar54;
            auVar103._0_16_ = auVar112;
            auVar181 = vmaskmovps_avx(auVar103,*(undefined1 (*) [32])(*pauVar27 + uVar37 * 4));
            auVar181 = vsubps_avx(auVar181,auVar170);
            auVar192._0_4_ = auVar145._0_4_ + auVar181._0_4_ * auVar181._0_4_;
            auVar192._4_4_ = auVar145._4_4_ + auVar181._4_4_ * auVar181._4_4_;
            auVar192._8_4_ = auVar145._8_4_ + auVar181._8_4_ * auVar181._8_4_;
            auVar192._12_4_ = auVar145._12_4_ + auVar181._12_4_ * auVar181._12_4_;
            auVar194._16_4_ = auVar145._16_4_ + auVar181._16_4_ * auVar181._16_4_;
            auVar194._0_16_ = auVar192;
            auVar194._20_4_ = auVar145._20_4_ + auVar181._20_4_ * auVar181._20_4_;
            auVar194._24_4_ = auVar145._24_4_ + auVar181._24_4_ * auVar181._24_4_;
            auVar194._28_4_ = auVar145._28_4_ + auVar181._28_4_;
            uVar37 = uVar37 + 8;
            auVar195 = ZEXT3264(auVar194);
          } while ((uVar34 + 8 & 0x1fffffff8) != uVar37);
          auVar60 = vorps_avx(auVar53,auVar48);
          auVar115._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
          auVar115._12_4_ = auVar83._12_4_ ^ 0x80000000;
          auVar60 = vpcmpgtq_avx(auVar115,auVar60);
          auVar54 = vpackssdw_avx(auVar60,auVar55);
          auVar60 = vorps_avx(auVar53,auVar48);
          auVar131._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
          auVar131._8_4_ = auVar84._8_4_;
          auVar131._12_4_ = auVar84._12_4_ ^ 0x80000000;
          auVar60 = vpcmpgtq_avx(auVar131,auVar60);
          auVar60 = vpackssdw_avx(auVar60,auVar129);
          auVar60 = vblendvps_avx(auVar145._0_16_,auVar192,auVar60 ^ auVar123);
          auVar54 = vblendvps_avx(auVar145._16_16_,auVar194._16_16_,auVar54 ^ auVar123);
          in_ZMM1 = ZEXT1664(auVar54);
          auVar60 = vhaddps_avx(auVar54,auVar60);
          auVar60 = vhaddps_avx(auVar60,auVar60);
          auVar60 = vhaddps_avx(auVar60,auVar60);
          fVar148 = auVar60._0_4_;
        }
        auVar60 = ZEXT416((uint)((1.0 / (float)(int)uVar30) * fVar148 + (this->super_GroupNorm).eps)
                         );
        auVar60 = vsqrtss_avx(auVar60,auVar60);
        fVar148 = 1.0 / auVar60._0_4_;
        fVar147 = fVar148 * -fVar147;
        if ((this->super_GroupNorm).affine == 0) {
          auVar60 = vshufps_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),0);
          auVar54 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
          fVar147 = auVar54._0_4_;
          fVar148 = auVar54._4_4_;
          fVar160 = auVar54._8_4_;
          fVar161 = auVar54._12_4_;
          fVar162 = auVar60._0_4_;
          fVar163 = auVar60._4_4_;
          fVar164 = auVar60._8_4_;
          fVar165 = auVar60._12_4_;
          uVar36 = 0;
          if (7 < (int)uVar30) {
            iVar21 = 7;
            do {
              auVar105._0_4_ = fVar162 * *(float *)*pauVar31 + fVar147;
              auVar105._4_4_ = fVar163 * *(float *)(*pauVar31 + 4) + fVar148;
              auVar105._8_4_ = fVar164 * *(float *)(*pauVar31 + 8) + fVar160;
              auVar105._12_4_ = fVar165 * *(float *)(*pauVar31 + 0xc) + fVar161;
              auVar105._16_4_ = fVar162 * *(float *)(*pauVar31 + 0x10) + fVar147;
              auVar105._20_4_ = fVar163 * *(float *)(*pauVar31 + 0x14) + fVar148;
              auVar105._24_4_ = fVar164 * *(float *)(*pauVar31 + 0x18) + fVar160;
              auVar105._28_4_ = in_ZMM1._28_4_ + fVar161;
              in_ZMM1 = ZEXT3264(auVar105);
              *pauVar31 = auVar105;
              pauVar31 = pauVar31 + 1;
              iVar21 = iVar21 + 8;
              uVar36 = uVar22;
            } while (iVar21 < (int)uVar30);
          }
          uVar23 = uVar36 | 3;
          while ((int)uVar23 < (int)uVar30) {
            fVar166 = *(float *)(*pauVar31 + 4);
            fVar157 = *(float *)(*pauVar31 + 8);
            fVar138 = *(float *)(*pauVar31 + 0xc);
            *(float *)*pauVar31 = fVar147 + fVar162 * *(float *)*pauVar31;
            *(float *)(*pauVar31 + 4) = fVar148 + fVar163 * fVar166;
            *(float *)(*pauVar31 + 8) = fVar160 + fVar164 * fVar157;
            *(float *)(*pauVar31 + 0xc) = fVar161 + fVar165 * fVar138;
            pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
            uVar23 = uVar36 + 7;
            uVar36 = uVar36 + 4;
          }
          if ((int)uVar36 < (int)uVar30) {
            uVar34 = CONCAT44(0,~uVar36 + uVar30);
            auVar61._8_8_ = 0;
            auVar61._0_8_ = uVar34;
            auVar52 = vpshufd_avx(auVar61,0x44);
            auVar60 = vorps_avx(auVar52,auVar48);
            auVar54 = vorps_avx(auVar52,auVar48);
            uVar37 = 0;
            do {
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar37;
              auVar53 = vpshufd_avx(auVar62,0x44);
              auVar86._16_16_ = auVar53;
              auVar86._0_16_ = auVar53;
              auVar84 = vorps_avx(auVar86,auVar15);
              auVar83 = vorps_avx(auVar86,auVar16);
              auVar53 = vorps_avx(auVar52,auVar48);
              auVar132._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
              auVar132._8_4_ = auVar83._24_4_;
              auVar132._12_4_ = auVar83._28_4_ ^ 0x80000000;
              auVar112 = vpcmpgtq_avx(auVar132,auVar53);
              auVar63._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
              auVar63._8_4_ = auVar83._8_4_;
              auVar63._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar55 = vpcmpgtq_avx(auVar63,auVar60);
              auVar112 = vpackssdw_avx(auVar55,auVar112);
              auVar133._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
              auVar133._8_4_ = auVar84._24_4_;
              auVar133._12_4_ = auVar84._28_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar133,auVar53);
              auVar97._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
              auVar97._8_4_ = auVar84._8_4_;
              auVar97._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar55 = vpcmpgtq_avx(auVar97,auVar54);
              auVar53 = vpackssdw_avx(auVar55,auVar53);
              auVar53 = vpackssdw_avx(auVar53 ^ auVar123,auVar112 ^ auVar123);
              auVar112 = vpmovsxwd_avx(auVar53);
              auVar53 = vpunpckhwd_avx(auVar53,auVar53);
              auVar87._16_16_ = auVar53;
              auVar87._0_16_ = auVar112;
              auVar84 = vmaskmovps_avx(auVar87,*(undefined1 (*) [32])(*pauVar31 + uVar37 * 4));
              auVar106._0_4_ = fVar147 + fVar162 * auVar84._0_4_;
              auVar106._4_4_ = fVar148 + fVar163 * auVar84._4_4_;
              auVar106._8_4_ = fVar160 + fVar164 * auVar84._8_4_;
              auVar106._12_4_ = fVar161 + fVar165 * auVar84._12_4_;
              auVar106._16_4_ = fVar147 + fVar162 * auVar84._16_4_;
              auVar106._20_4_ = fVar148 + fVar163 * auVar84._20_4_;
              auVar106._24_4_ = fVar160 + fVar164 * auVar84._24_4_;
              auVar106._28_4_ = fVar161 + auVar84._28_4_;
              in_ZMM1 = ZEXT3264(auVar106);
              auVar84 = vmaskmovps_avx(auVar87,auVar106);
              *(undefined1 (*) [32])(*pauVar31 + uVar37 * 4) = auVar84;
              uVar37 = uVar37 + 8;
            } while ((uVar34 + 8 & 0x1fffffff8) != uVar37);
          }
        }
        else if (0 < (int)uVar19) {
          pfVar28 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar32 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar33 = (float *)(lVar32 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar36 = 0;
          do {
            fVar160 = fVar147 * *pfVar28;
            in_ZMM1 = ZEXT464((uint)fVar160);
            fVar160 = fVar160 + *pfVar33;
            fVar161 = fVar148 * *pfVar28;
            auVar60 = vshufps_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),0);
            auVar54 = vshufps_avx(ZEXT416((uint)fVar160),ZEXT416((uint)fVar160),0);
            fVar165 = auVar54._0_4_;
            fVar166 = auVar54._4_4_;
            fVar157 = auVar54._8_4_;
            fVar138 = auVar54._12_4_;
            fVar162 = auVar60._0_4_;
            fVar163 = auVar60._4_4_;
            fVar164 = auVar60._8_4_;
            if ((int)uVar20 < 8) {
              uVar23 = 0;
            }
            else {
              iVar21 = 7;
              do {
                auVar104._0_4_ = fVar162 * *(float *)*pauVar31 + fVar165;
                auVar104._4_4_ = fVar163 * *(float *)(*pauVar31 + 4) + fVar166;
                auVar104._8_4_ = fVar164 * *(float *)(*pauVar31 + 8) + fVar157;
                auVar104._12_4_ = auVar60._12_4_ * *(float *)(*pauVar31 + 0xc) + fVar138;
                auVar104._16_4_ = fVar162 * *(float *)(*pauVar31 + 0x10) + fVar165;
                auVar104._20_4_ = fVar163 * *(float *)(*pauVar31 + 0x14) + fVar166;
                auVar104._24_4_ = fVar164 * *(float *)(*pauVar31 + 0x18) + fVar157;
                auVar104._28_4_ = in_ZMM1._28_4_ + fVar138;
                in_ZMM1 = ZEXT3264(auVar104);
                *pauVar31 = auVar104;
                pauVar31 = pauVar31 + 1;
                iVar21 = iVar21 + 8;
                uVar23 = uVar20 & 0xfffffff8;
              } while (iVar21 < (int)uVar20);
            }
            uVar35 = uVar23 | 3;
            while ((int)uVar35 < (int)uVar20) {
              fVar146 = *(float *)(*pauVar31 + 4);
              fVar149 = *(float *)(*pauVar31 + 8);
              fVar150 = *(float *)(*pauVar31 + 0xc);
              *(float *)*pauVar31 = fVar165 + fVar162 * *(float *)*pauVar31;
              *(float *)(*pauVar31 + 4) = fVar166 + fVar163 * fVar146;
              *(float *)(*pauVar31 + 8) = fVar157 + fVar164 * fVar149;
              *(float *)(*pauVar31 + 0xc) = fVar138 + auVar60._12_4_ * fVar150;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
              uVar35 = uVar23 + 7;
              uVar23 = uVar23 + 4;
            }
            iVar21 = uVar20 - uVar23;
            if (iVar21 != 0 && (int)uVar23 <= (int)uVar20) {
              do {
                *(float *)*pauVar31 = fVar160 + fVar161 * *(float *)*pauVar31;
                pauVar31 = (undefined1 (*) [32])(*pauVar31 + 4);
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            pfVar28 = pfVar28 + 1;
            pfVar33 = pfVar33 + 1;
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar19);
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < (this->super_GroupNorm).group);
    }
  }
  else if (iVar21 == 1) {
    if (0 < iVar24) {
      uVar20 = uVar19 & 0xfffffff8;
      lVar29 = 0;
      auVar121._8_8_ = 0x8000000000000000;
      auVar121._0_8_ = 0x8000000000000000;
      auVar123 = vpcmpeqd_avx(auVar123,auVar123);
      do {
        lVar32 = lVar29 * (int)uVar19;
        pauVar31 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar32 + (long)bottom_top_blob->data);
        fVar147 = 0.0;
        fVar148 = 0.0;
        fVar138 = 0.0;
        fVar146 = 0.0;
        fVar149 = 0.0;
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar152 = 0.0;
        pauVar27 = pauVar31;
        uVar30 = 0;
        fVar160 = 0.0;
        fVar161 = 0.0;
        fVar162 = 0.0;
        fVar163 = 0.0;
        fVar164 = 0.0;
        fVar165 = 0.0;
        fVar166 = 0.0;
        fVar157 = 0.0;
        if (7 < (int)uVar19) {
          iVar21 = 7;
          do {
            fVar138 = fVar138 + *(float *)*pauVar27;
            fVar146 = fVar146 + *(float *)(*pauVar27 + 4);
            fVar147 = fVar147 + *(float *)(*pauVar27 + 8);
            fVar148 = fVar148 + *(float *)(*pauVar27 + 0xc);
            fVar149 = fVar149 + *(float *)(*pauVar27 + 0x10);
            fVar150 = fVar150 + *(float *)(*pauVar27 + 0x14);
            fVar151 = fVar151 + *(float *)(*pauVar27 + 0x18);
            fVar152 = fVar152 + *(float *)(*pauVar27 + 0x1c);
            pauVar27 = pauVar27 + 1;
            iVar21 = iVar21 + 8;
            uVar30 = uVar20;
            fVar160 = fVar138;
            fVar161 = fVar146;
            fVar162 = fVar147;
            fVar163 = fVar148;
            fVar164 = fVar149;
            fVar165 = fVar150;
            fVar166 = fVar151;
            fVar157 = fVar152;
          } while (iVar21 < (int)uVar19);
        }
        uVar22 = uVar30 | 3;
        auVar153 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar147 = auVar153._4_4_;
          fVar148 = auVar153._8_4_;
          fVar138 = auVar153._12_4_;
          if ((int)uVar19 <= (int)uVar22) break;
          auVar153._0_4_ = auVar153._0_4_ + *(float *)*pauVar27;
          auVar153._4_4_ = fVar147 + *(float *)(*pauVar27 + 4);
          auVar153._8_4_ = fVar148 + *(float *)(*pauVar27 + 8);
          auVar153._12_4_ = fVar138 + *(float *)(*pauVar27 + 0xc);
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          uVar22 = uVar30 + 7;
          uVar30 = uVar30 + 4;
        }
        auVar40._0_4_ = fVar160 + fVar164;
        auVar40._4_4_ = fVar161 + fVar165;
        auVar40._8_4_ = fVar162 + fVar166;
        auVar40._12_4_ = fVar163 + fVar157;
        auVar48 = vshufpd_avx(auVar40,auVar40,1);
        auVar41._0_4_ = auVar48._0_4_ + auVar40._0_4_;
        auVar41._4_4_ = auVar48._4_4_ + auVar40._4_4_;
        auVar41._8_4_ = auVar48._8_4_ + auVar40._8_4_;
        auVar41._12_4_ = auVar48._12_4_ + auVar40._12_4_;
        auVar48 = vshufpd_avx(auVar153,auVar153,1);
        auVar108._0_4_ = auVar153._0_4_ + auVar48._0_4_;
        auVar108._4_4_ = fVar147 + auVar48._4_4_;
        auVar108._8_4_ = fVar148 + auVar48._8_4_;
        auVar108._12_4_ = fVar138 + auVar48._12_4_;
        auVar48 = vhaddps_avx(auVar41,auVar41);
        auVar60 = vmovshdup_avx(auVar108);
        fVar147 = auVar48._0_4_ + auVar60._0_4_ + auVar108._0_4_;
        if ((int)uVar30 < (int)uVar19) {
          uVar34 = CONCAT44(0,~uVar30 + uVar19);
          auVar48 = vblendps_avx(ZEXT416((uint)fVar147),_DAT_005a5060,0xe);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar34;
          auVar52 = vpshufd_avx(auVar42,0x44);
          auVar60 = vorps_avx(auVar52,auVar121);
          auVar54 = vorps_avx(auVar52,auVar121);
          uVar37 = 0;
          auVar195 = ZEXT1664(auVar48);
          do {
            auVar145 = auVar195;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar37;
            auVar48 = vpshufd_avx(auVar43,0x44);
            auVar78._16_16_ = auVar48;
            auVar78._0_16_ = auVar48;
            auVar84 = vorps_avx(auVar78,auVar15);
            auVar83 = vorps_avx(auVar78,auVar16);
            auVar48 = vorps_avx(auVar52,auVar121);
            auVar124._8_4_ = auVar83._24_4_;
            auVar124._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
            auVar124._12_4_ = auVar83._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar124,auVar48);
            auVar109._8_4_ = auVar83._8_4_;
            auVar176._8_4_ = auVar109._8_4_;
            auVar176._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
            auVar176._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar176,auVar60);
            auVar53 = vpackssdw_avx(auVar53,auVar112);
            auVar183._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
            auVar183._8_4_ = auVar84._24_4_;
            auVar183._12_4_ = auVar84._28_4_ ^ 0x80000000;
            auVar55 = vpcmpgtq_avx(auVar183,auVar48);
            auVar184._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
            auVar184._8_4_ = auVar84._8_4_;
            auVar184._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar48 = vpcmpgtq_avx(auVar184,auVar54);
            auVar48 = vpackssdw_avx(auVar48,auVar55);
            auVar48 = vpackssdw_avx(auVar48 ^ auVar123,auVar53 ^ auVar123);
            auVar53 = vpmovsxwd_avx(auVar48);
            auVar48 = vpunpckhwd_avx(auVar48,auVar48);
            auVar180._16_16_ = auVar48;
            auVar180._0_16_ = auVar53;
            auVar181 = vmaskmovps_avx(auVar180,*(undefined1 (*) [32])(*pauVar27 + uVar37 * 4));
            auVar139._0_4_ = auVar181._0_4_ + auVar145._0_4_;
            auVar139._4_4_ = auVar181._4_4_ + auVar145._4_4_;
            auVar139._8_4_ = auVar181._8_4_ + auVar145._8_4_;
            auVar139._12_4_ = auVar181._12_4_ + auVar145._12_4_;
            auVar142._16_4_ = auVar181._16_4_ + auVar145._16_4_;
            auVar142._0_16_ = auVar139;
            auVar142._20_4_ = auVar181._20_4_ + auVar145._20_4_;
            auVar142._24_4_ = auVar181._24_4_ + auVar145._24_4_;
            auVar142._28_4_ = auVar181._28_4_ + auVar145._28_4_;
            uVar37 = uVar37 + 8;
            auVar195 = ZEXT3264(auVar142);
          } while ((uVar34 + 8 & 0x1fffffff8) != uVar37);
          auVar48 = vorps_avx(auVar52,auVar121);
          auVar109._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
          auVar109._12_4_ = auVar83._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar109,auVar48);
          auVar60 = vpackssdw_avx(auVar48,auVar112);
          auVar48 = vorps_avx(auVar52,auVar121);
          auVar154._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
          auVar154._8_4_ = auVar84._8_4_;
          auVar154._12_4_ = auVar84._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar154,auVar48);
          auVar48 = vpackssdw_avx(auVar48,auVar55);
          auVar48 = vblendvps_avx(auVar145._0_16_,auVar139,auVar48 ^ auVar123);
          auVar60 = vblendvps_avx(auVar145._16_16_,auVar142._16_16_,auVar60 ^ auVar123);
          auVar48 = vhaddps_avx(auVar60,auVar48);
          auVar48 = vhaddps_avx(auVar48,auVar48);
          auVar48 = vhaddps_avx(auVar48,auVar48);
          fVar147 = auVar48._0_4_;
        }
        fVar147 = (1.0 / (float)(int)uVar19) * fVar147;
        auVar48 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
        pauVar27 = pauVar31;
        if ((int)uVar19 < 8) {
          fVar148 = 0.0;
          fVar160 = 0.0;
          fVar161 = 0.0;
          fVar162 = 0.0;
          fVar163 = 0.0;
          fVar164 = 0.0;
          fVar165 = 0.0;
          fVar166 = 0.0;
          uVar30 = 0;
        }
        else {
          auVar79._16_16_ = auVar48;
          auVar79._0_16_ = auVar48;
          fVar148 = 0.0;
          fVar160 = 0.0;
          fVar161 = 0.0;
          fVar162 = 0.0;
          fVar163 = 0.0;
          fVar164 = 0.0;
          fVar165 = 0.0;
          fVar166 = 0.0;
          iVar21 = 7;
          do {
            auVar84 = vsubps_avx(*pauVar27,auVar79);
            fVar148 = fVar148 + auVar84._0_4_ * auVar84._0_4_;
            fVar160 = fVar160 + auVar84._4_4_ * auVar84._4_4_;
            fVar161 = fVar161 + auVar84._8_4_ * auVar84._8_4_;
            fVar162 = fVar162 + auVar84._12_4_ * auVar84._12_4_;
            fVar163 = fVar163 + auVar84._16_4_ * auVar84._16_4_;
            fVar164 = fVar164 + auVar84._20_4_ * auVar84._20_4_;
            fVar165 = fVar165 + auVar84._24_4_ * auVar84._24_4_;
            fVar166 = fVar166 + auVar84._28_4_;
            pauVar27 = pauVar27 + 1;
            iVar21 = iVar21 + 8;
            uVar30 = uVar20;
          } while (iVar21 < (int)uVar19);
        }
        uVar22 = uVar30 | 3;
        auVar167 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar157 = auVar167._4_4_;
          fVar138 = auVar167._8_4_;
          fVar146 = auVar167._12_4_;
          if ((int)uVar19 <= (int)uVar22) break;
          auVar60 = vsubps_avx(*(undefined1 (*) [16])*pauVar27,auVar48);
          auVar167._0_4_ = auVar167._0_4_ + auVar60._0_4_ * auVar60._0_4_;
          auVar167._4_4_ = fVar157 + auVar60._4_4_ * auVar60._4_4_;
          auVar167._8_4_ = fVar138 + auVar60._8_4_ * auVar60._8_4_;
          auVar167._12_4_ = fVar146 + auVar60._12_4_ * auVar60._12_4_;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          uVar22 = uVar30 + 7;
          uVar30 = uVar30 + 4;
        }
        auVar44._0_4_ = fVar148 + fVar163;
        auVar44._4_4_ = fVar160 + fVar164;
        auVar44._8_4_ = fVar161 + fVar165;
        auVar44._12_4_ = fVar162 + fVar166;
        auVar60 = vshufpd_avx(auVar44,auVar44,1);
        auVar45._0_4_ = auVar60._0_4_ + auVar44._0_4_;
        auVar45._4_4_ = auVar60._4_4_ + auVar44._4_4_;
        auVar45._8_4_ = auVar60._8_4_ + auVar44._8_4_;
        auVar45._12_4_ = auVar60._12_4_ + auVar44._12_4_;
        auVar60 = vshufpd_avx(auVar167,auVar167,1);
        auVar110._0_4_ = auVar167._0_4_ + auVar60._0_4_;
        auVar110._4_4_ = fVar157 + auVar60._4_4_;
        auVar110._8_4_ = fVar138 + auVar60._8_4_;
        auVar110._12_4_ = fVar146 + auVar60._12_4_;
        auVar60 = vhaddps_avx(auVar45,auVar45);
        auVar54 = vmovshdup_avx(auVar110);
        fVar148 = auVar60._0_4_ + auVar54._0_4_ + auVar110._0_4_;
        if ((int)uVar30 < (int)uVar19) {
          uVar34 = CONCAT44(0,~uVar30 + uVar19);
          auVar60 = vblendps_avx(ZEXT416((uint)fVar148),_DAT_005a5060,0xe);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar34;
          auVar52 = vpshufd_avx(auVar46,0x44);
          auVar169._16_16_ = auVar48;
          auVar169._0_16_ = auVar48;
          auVar48 = vorps_avx(auVar52,auVar121);
          auVar54 = vorps_avx(auVar52,auVar121);
          uVar37 = 0;
          auVar195 = ZEXT1664(auVar60);
          do {
            auVar145 = auVar195;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar37;
            auVar60 = vpshufd_avx(auVar47,0x44);
            auVar80._16_16_ = auVar60;
            auVar80._0_16_ = auVar60;
            auVar84 = vorps_avx(auVar80,auVar15);
            auVar83 = vorps_avx(auVar80,auVar16);
            auVar60 = vorps_avx(auVar52,auVar121);
            auVar125._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
            auVar125._8_4_ = auVar83._24_4_;
            auVar125._12_4_ = auVar83._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar125,auVar60);
            auVar189._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
            auVar111._8_4_ = auVar83._8_4_;
            auVar189._8_4_ = auVar111._8_4_;
            auVar189._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar189,auVar48);
            auVar53 = vpackssdw_avx(auVar53,auVar112);
            auVar92._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
            auVar92._8_4_ = auVar84._24_4_;
            auVar92._12_4_ = auVar84._28_4_ ^ 0x80000000;
            auVar55 = vpcmpgtq_avx(auVar92,auVar60);
            auVar93._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
            auVar93._8_4_ = auVar84._8_4_;
            auVar93._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar60 = vpcmpgtq_avx(auVar93,auVar54);
            auVar60 = vpackssdw_avx(auVar60,auVar55);
            auVar60 = vpackssdw_avx(auVar60 ^ auVar123,auVar53 ^ auVar123);
            auVar53 = vpmovsxwd_avx(auVar60);
            auVar60 = vpunpckhwd_avx(auVar60,auVar60);
            auVar101._16_16_ = auVar60;
            auVar101._0_16_ = auVar53;
            auVar181 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(*pauVar27 + uVar37 * 4));
            auVar181 = vsubps_avx(auVar181,auVar169);
            auVar190._0_4_ = auVar145._0_4_ + auVar181._0_4_ * auVar181._0_4_;
            auVar190._4_4_ = auVar145._4_4_ + auVar181._4_4_ * auVar181._4_4_;
            auVar190._8_4_ = auVar145._8_4_ + auVar181._8_4_ * auVar181._8_4_;
            auVar190._12_4_ = auVar145._12_4_ + auVar181._12_4_ * auVar181._12_4_;
            auVar193._16_4_ = auVar145._16_4_ + auVar181._16_4_ * auVar181._16_4_;
            auVar193._0_16_ = auVar190;
            auVar193._20_4_ = auVar145._20_4_ + auVar181._20_4_ * auVar181._20_4_;
            auVar193._24_4_ = auVar145._24_4_ + auVar181._24_4_ * auVar181._24_4_;
            auVar193._28_4_ = auVar145._28_4_ + auVar181._28_4_;
            uVar37 = uVar37 + 8;
            auVar195 = ZEXT3264(auVar193);
          } while ((uVar34 + 8 & 0x1fffffff8) != uVar37);
          auVar48 = vorps_avx(auVar52,auVar121);
          auVar111._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
          auVar111._12_4_ = auVar83._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar111,auVar48);
          auVar60 = vpackssdw_avx(auVar48,auVar112);
          auVar48 = vorps_avx(auVar52,auVar121);
          auVar126._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
          auVar126._8_4_ = auVar84._8_4_;
          auVar126._12_4_ = auVar84._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar126,auVar48);
          auVar48 = vpackssdw_avx(auVar48,auVar55);
          auVar48 = vblendvps_avx(auVar145._0_16_,auVar190,auVar48 ^ auVar123);
          auVar60 = vblendvps_avx(auVar145._16_16_,auVar193._16_16_,auVar60 ^ auVar123);
          auVar48 = vhaddps_avx(auVar60,auVar48);
          auVar48 = vhaddps_avx(auVar48,auVar48);
          auVar48 = vhaddps_avx(auVar48,auVar48);
          fVar148 = auVar48._0_4_;
        }
        auVar48 = ZEXT416((uint)((1.0 / (float)(int)uVar19) * fVar148 + (this->super_GroupNorm).eps)
                         );
        auVar48 = vsqrtss_avx(auVar48,auVar48);
        fVar138 = 1.0 / auVar48._0_4_;
        fVar148 = 0.0;
        fVar147 = fVar138 * -fVar147;
        auVar48 = vshufps_avx(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),0);
        auVar60 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
        fVar160 = auVar48._0_4_;
        fVar161 = auVar48._4_4_;
        fVar162 = auVar48._8_4_;
        fVar163 = auVar48._12_4_;
        fVar164 = auVar60._0_4_;
        fVar165 = auVar60._4_4_;
        fVar166 = auVar60._8_4_;
        fVar157 = auVar60._12_4_;
        if ((this->super_GroupNorm).affine == 0) {
          uVar30 = 0;
          if (7 < (int)uVar19) {
            iVar21 = 7;
            do {
              fVar147 = *(float *)(*pauVar31 + 4);
              fVar138 = *(float *)(*pauVar31 + 8);
              fVar146 = *(float *)(*pauVar31 + 0xc);
              fVar149 = *(float *)(*pauVar31 + 0x10);
              fVar150 = *(float *)(*pauVar31 + 0x14);
              fVar151 = *(float *)(*pauVar31 + 0x18);
              fVar148 = fVar157 + fVar148;
              *(float *)*pauVar31 = fVar164 + fVar160 * *(float *)*pauVar31;
              *(float *)(*pauVar31 + 4) = fVar165 + fVar161 * fVar147;
              *(float *)(*pauVar31 + 8) = fVar166 + fVar162 * fVar138;
              *(float *)(*pauVar31 + 0xc) = fVar157 + fVar163 * fVar146;
              *(float *)(*pauVar31 + 0x10) = fVar164 + fVar160 * fVar149;
              *(float *)(*pauVar31 + 0x14) = fVar165 + fVar161 * fVar150;
              *(float *)(*pauVar31 + 0x18) = fVar166 + fVar162 * fVar151;
              *(float *)(*pauVar31 + 0x1c) = fVar148;
              pauVar31 = pauVar31 + 1;
              iVar21 = iVar21 + 8;
              uVar30 = uVar20;
            } while (iVar21 < (int)uVar19);
          }
          uVar22 = uVar30 | 3;
          while ((int)uVar22 < (int)uVar19) {
            fVar147 = *(float *)(*pauVar31 + 4);
            fVar148 = *(float *)(*pauVar31 + 8);
            fVar138 = *(float *)(*pauVar31 + 0xc);
            *(float *)*pauVar31 = fVar164 + fVar160 * *(float *)*pauVar31;
            *(float *)(*pauVar31 + 4) = fVar165 + fVar161 * fVar147;
            *(float *)(*pauVar31 + 8) = fVar166 + fVar162 * fVar148;
            *(float *)(*pauVar31 + 0xc) = fVar157 + fVar163 * fVar138;
            pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
            uVar22 = uVar30 + 7;
            uVar30 = uVar30 + 4;
          }
          if ((int)uVar30 < (int)uVar19) {
            uVar34 = CONCAT44(0,~uVar30 + uVar19);
            auVar49._8_8_ = 0;
            auVar49._0_8_ = uVar34;
            auVar54 = vpshufd_avx(auVar49,0x44);
            auVar48 = vorps_avx(auVar54,auVar121);
            auVar60 = vorps_avx(auVar54,auVar121);
            uVar37 = 0;
            do {
              auVar50._8_8_ = 0;
              auVar50._0_8_ = uVar37;
              auVar52 = vpshufd_avx(auVar50,0x44);
              auVar81._16_16_ = auVar52;
              auVar81._0_16_ = auVar52;
              auVar84 = vorps_avx(auVar81,auVar15);
              auVar83 = vorps_avx(auVar81,auVar16);
              auVar52 = vorps_avx(auVar54,auVar121);
              auVar127._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
              auVar127._8_4_ = auVar83._24_4_;
              auVar127._12_4_ = auVar83._28_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar127,auVar52);
              auVar51._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
              auVar51._8_4_ = auVar83._8_4_;
              auVar51._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar112 = vpcmpgtq_avx(auVar51,auVar48);
              auVar53 = vpackssdw_avx(auVar112,auVar53);
              auVar128._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
              auVar128._8_4_ = auVar84._24_4_;
              auVar128._12_4_ = auVar84._28_4_ ^ 0x80000000;
              auVar52 = vpcmpgtq_avx(auVar128,auVar52);
              auVar94._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
              auVar94._8_4_ = auVar84._8_4_;
              auVar94._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar112 = vpcmpgtq_avx(auVar94,auVar60);
              auVar52 = vpackssdw_avx(auVar112,auVar52);
              auVar52 = vpackssdw_avx(auVar52 ^ auVar123,auVar53 ^ auVar123);
              auVar53 = vpmovsxwd_avx(auVar52);
              auVar52 = vpunpckhwd_avx(auVar52,auVar52);
              auVar82._16_16_ = auVar52;
              auVar82._0_16_ = auVar53;
              auVar84 = vmaskmovps_avx(auVar82,*(undefined1 (*) [32])(*pauVar31 + uVar37 * 4));
              auVar102._0_4_ = fVar164 + fVar160 * auVar84._0_4_;
              auVar102._4_4_ = fVar165 + fVar161 * auVar84._4_4_;
              auVar102._8_4_ = fVar166 + fVar162 * auVar84._8_4_;
              auVar102._12_4_ = fVar157 + fVar163 * auVar84._12_4_;
              auVar102._16_4_ = fVar164 + fVar160 * auVar84._16_4_;
              auVar102._20_4_ = fVar165 + fVar161 * auVar84._20_4_;
              auVar102._24_4_ = fVar166 + fVar162 * auVar84._24_4_;
              auVar102._28_4_ = fVar157 + auVar84._28_4_;
              auVar84 = vmaskmovps_avx(auVar82,auVar102);
              *(undefined1 (*) [32])(*pauVar31 + uVar37 * 4) = auVar84;
              uVar37 = uVar37 + 8;
            } while ((uVar34 + 8 & 0x1fffffff8) != uVar37);
          }
        }
        else {
          pfVar28 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar32 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar33 = (float *)(lVar32 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar30 = 0;
          if (7 < (int)uVar19) {
            iVar21 = 7;
            do {
              fVar146 = *(float *)(*pauVar31 + 4);
              fVar149 = *(float *)(*pauVar31 + 8);
              fVar150 = *(float *)(*pauVar31 + 0xc);
              fVar151 = *(float *)(*pauVar31 + 0x10);
              fVar152 = *(float *)(*pauVar31 + 0x14);
              fVar2 = *(float *)(*pauVar31 + 0x18);
              fVar3 = pfVar28[1];
              fVar4 = pfVar28[2];
              fVar5 = pfVar28[3];
              fVar6 = pfVar28[4];
              fVar7 = pfVar28[5];
              fVar8 = pfVar28[6];
              fVar9 = pfVar33[1];
              fVar10 = pfVar33[2];
              fVar11 = pfVar33[3];
              fVar12 = pfVar33[4];
              fVar13 = pfVar33[5];
              fVar14 = pfVar33[6];
              fVar148 = fVar157 + fVar148 + pfVar33[7];
              *(float *)*pauVar31 = (fVar164 + fVar160 * *(float *)*pauVar31) * *pfVar28 + *pfVar33;
              *(float *)(*pauVar31 + 4) = (fVar165 + fVar161 * fVar146) * fVar3 + fVar9;
              *(float *)(*pauVar31 + 8) = (fVar166 + fVar162 * fVar149) * fVar4 + fVar10;
              *(float *)(*pauVar31 + 0xc) = (fVar157 + fVar163 * fVar150) * fVar5 + fVar11;
              *(float *)(*pauVar31 + 0x10) = (fVar164 + fVar160 * fVar151) * fVar6 + fVar12;
              *(float *)(*pauVar31 + 0x14) = (fVar165 + fVar161 * fVar152) * fVar7 + fVar13;
              *(float *)(*pauVar31 + 0x18) = (fVar166 + fVar162 * fVar2) * fVar8 + fVar14;
              *(float *)(*pauVar31 + 0x1c) = fVar148;
              pfVar28 = pfVar28 + 8;
              pfVar33 = pfVar33 + 8;
              pauVar31 = pauVar31 + 1;
              iVar21 = iVar21 + 8;
              uVar30 = uVar20;
            } while (iVar21 < (int)uVar19);
          }
          uVar22 = uVar30 | 3;
          while ((int)uVar22 < (int)uVar19) {
            fVar148 = *(float *)(*pauVar31 + 4);
            fVar146 = *(float *)(*pauVar31 + 8);
            fVar149 = *(float *)(*pauVar31 + 0xc);
            fVar150 = pfVar28[1];
            fVar151 = pfVar28[2];
            fVar152 = pfVar28[3];
            fVar2 = pfVar33[1];
            fVar3 = pfVar33[2];
            fVar4 = pfVar33[3];
            *(float *)*pauVar31 = (fVar164 + fVar160 * *(float *)*pauVar31) * *pfVar28 + *pfVar33;
            *(float *)(*pauVar31 + 4) = (fVar165 + fVar161 * fVar148) * fVar150 + fVar2;
            *(float *)(*pauVar31 + 8) = (fVar166 + fVar162 * fVar146) * fVar151 + fVar3;
            *(float *)(*pauVar31 + 0xc) = (fVar157 + fVar163 * fVar149) * fVar152 + fVar4;
            pfVar28 = pfVar28 + 4;
            pfVar33 = pfVar33 + 4;
            pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
            uVar22 = uVar30 + 7;
            uVar30 = uVar30 + 4;
          }
          if ((int)uVar30 < (int)uVar19) {
            lVar32 = 0;
            do {
              *(float *)(*pauVar31 + lVar32 * 4) =
                   (fVar147 + fVar138 * *(float *)(*pauVar31 + lVar32 * 4)) * pfVar28[lVar32] +
                   pfVar33[lVar32];
              lVar32 = lVar32 + 1;
            } while (uVar19 - uVar30 != (int)lVar32);
          }
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < (this->super_GroupNorm).group);
    }
  }
  else if ((iVar21 - 3U < 2) && (0 < iVar24)) {
    uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar30 = uVar20 & 0xfffffff8;
    fVar147 = 1.0 / (float)(int)(uVar20 * uVar19);
    lVar29 = 0;
    auVar195 = ZEXT1264(ZEXT812(0));
    auVar122._8_8_ = 0x8000000000000000;
    auVar122._0_8_ = 0x8000000000000000;
    auVar123 = vpcmpeqd_avx(auVar123,auVar123);
    do {
      lVar39 = lVar29 * (int)uVar19;
      uVar34 = bottom_top_blob->elemsize;
      lVar32 = bottom_top_blob->cstep * lVar39 * uVar34;
      pvVar1 = bottom_top_blob->data;
      uVar17 = ((long)bottom_top_blob->d * uVar34 *
                (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
               uVar34;
      pfVar28 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar39 +
                         (long)(this->super_GroupNorm).gamma_data.data);
      pfVar33 = (float *)(lVar39 * (this->super_GroupNorm).beta_data.elemsize +
                         (long)(this->super_GroupNorm).beta_data.data);
      if ((int)uVar19 < 1) {
        auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar148 = 0.0;
      }
      else {
        lVar39 = uVar17 * uVar34;
        auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar25 = 0;
        do {
          pfVar18 = (float *)((long)pvVar1 + lVar39 * uVar25 + lVar32);
          if ((int)uVar20 < 8) {
            fVar148 = 0.0;
            fVar160 = 0.0;
            fVar161 = 0.0;
            fVar162 = 0.0;
            fVar163 = 0.0;
            fVar164 = 0.0;
            fVar165 = 0.0;
            fVar166 = 0.0;
            uVar22 = 0;
          }
          else {
            fVar148 = 0.0;
            fVar160 = 0.0;
            fVar161 = 0.0;
            fVar162 = 0.0;
            fVar163 = 0.0;
            fVar164 = 0.0;
            fVar165 = 0.0;
            fVar166 = 0.0;
            iVar21 = 7;
            do {
              fVar148 = fVar148 + *pfVar18;
              fVar160 = fVar160 + pfVar18[1];
              fVar161 = fVar161 + pfVar18[2];
              fVar162 = fVar162 + pfVar18[3];
              fVar163 = fVar163 + pfVar18[4];
              fVar164 = fVar164 + pfVar18[5];
              fVar165 = fVar165 + pfVar18[6];
              fVar166 = fVar166 + pfVar18[7];
              pfVar18 = pfVar18 + 8;
              iVar21 = iVar21 + 8;
              uVar22 = uVar30;
            } while (iVar21 < (int)uVar20);
          }
          uVar36 = uVar22 | 3;
          auVar158 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar157 = auVar158._4_4_;
            fVar138 = auVar158._8_4_;
            fVar146 = auVar158._12_4_;
            if ((int)uVar20 <= (int)uVar36) break;
            auVar158._0_4_ = auVar158._0_4_ + *pfVar18;
            auVar158._4_4_ = fVar157 + pfVar18[1];
            auVar158._8_4_ = fVar138 + pfVar18[2];
            auVar158._12_4_ = fVar146 + pfVar18[3];
            pfVar18 = pfVar18 + 4;
            uVar36 = uVar22 + 7;
            uVar22 = uVar22 + 4;
          }
          auVar64._0_4_ = fVar148 + fVar163;
          auVar64._4_4_ = fVar160 + fVar164;
          auVar64._8_4_ = fVar161 + fVar165;
          auVar64._12_4_ = fVar162 + fVar166;
          auVar48 = vshufpd_avx(auVar64,auVar64,1);
          auVar65._0_4_ = auVar48._0_4_ + auVar64._0_4_;
          auVar65._4_4_ = auVar48._4_4_ + auVar64._4_4_;
          auVar65._8_4_ = auVar48._8_4_ + auVar64._8_4_;
          auVar65._12_4_ = auVar48._12_4_ + auVar64._12_4_;
          auVar48 = vmovshdup_avx(auVar65);
          auVar60 = vshufpd_avx(auVar158,auVar158,1);
          auVar134._0_4_ = auVar158._0_4_ + auVar60._0_4_;
          auVar134._4_4_ = fVar157 + auVar60._4_4_;
          auVar134._8_4_ = fVar138 + auVar60._8_4_;
          auVar134._12_4_ = fVar146 + auVar60._12_4_;
          auVar60 = vmovshdup_avx(auVar134);
          fVar148 = auVar60._0_4_ + auVar145._0_4_ + auVar48._0_4_ + auVar65._0_4_ + auVar134._0_4_;
          auVar145 = ZEXT464((uint)fVar148);
          if ((int)uVar22 < (int)uVar20) {
            uVar26 = CONCAT44(0,~uVar22 + uVar20);
            auVar66._8_8_ = 0;
            auVar66._0_8_ = uVar26;
            auVar54 = vpshufd_avx(auVar66,0x44);
            auVar48 = vorps_avx(auVar54,auVar122);
            auVar60 = vorps_avx(auVar54,auVar122);
            uVar38 = 0;
            auVar145 = ZEXT1664(CONCAT124(auVar195._4_12_,fVar148));
            do {
              auVar175 = auVar145;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = uVar38;
              auVar52 = vpshufd_avx(auVar67,0x44);
              auVar88._16_16_ = auVar52;
              auVar88._0_16_ = auVar52;
              auVar84 = vorps_avx(auVar88,auVar15);
              auVar83 = vorps_avx(auVar88,auVar16);
              auVar52 = vorps_avx(auVar54,auVar122);
              auVar98._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
              auVar98._8_4_ = auVar83._24_4_;
              auVar98._12_4_ = auVar83._28_4_ ^ 0x80000000;
              auVar112 = vpcmpgtq_avx(auVar98,auVar52);
              auVar178._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
              auVar68._8_4_ = auVar83._8_4_;
              auVar178._8_4_ = auVar68._8_4_;
              auVar178._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar178,auVar48);
              auVar53 = vpackssdw_avx(auVar53,auVar112);
              auVar187._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
              auVar187._8_4_ = auVar84._24_4_;
              auVar187._12_4_ = auVar84._28_4_ ^ 0x80000000;
              auVar55 = vpcmpgtq_avx(auVar187,auVar52);
              auVar188._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
              auVar188._8_4_ = auVar84._8_4_;
              auVar188._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar52 = vpcmpgtq_avx(auVar188,auVar60);
              auVar52 = vpackssdw_avx(auVar52,auVar55);
              auVar52 = vpackssdw_avx(auVar52 ^ auVar123,auVar53 ^ auVar123);
              auVar53 = vpmovsxwd_avx(auVar52);
              auVar52 = vpunpckhwd_avx(auVar52,auVar52);
              auVar182._16_16_ = auVar52;
              auVar182._0_16_ = auVar53;
              auVar181 = vmaskmovps_avx(auVar182,*(undefined1 (*) [32])(pfVar18 + uVar38));
              auVar141._0_4_ = auVar181._0_4_ + auVar175._0_4_;
              auVar141._4_4_ = auVar181._4_4_ + auVar175._4_4_;
              auVar141._8_4_ = auVar181._8_4_ + auVar175._8_4_;
              auVar141._12_4_ = auVar181._12_4_ + auVar175._12_4_;
              auVar144._16_4_ = auVar181._16_4_ + auVar175._16_4_;
              auVar144._0_16_ = auVar141;
              auVar144._20_4_ = auVar181._20_4_ + auVar175._20_4_;
              auVar144._24_4_ = auVar181._24_4_ + auVar175._24_4_;
              auVar144._28_4_ = auVar181._28_4_ + auVar175._28_4_;
              uVar38 = uVar38 + 8;
              auVar145 = ZEXT3264(auVar144);
            } while ((uVar26 + 8 & 0x1fffffff8) != uVar38);
            auVar48 = vorps_avx(auVar54,auVar122);
            auVar68._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
            auVar68._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar48 = vpcmpgtq_avx(auVar68,auVar48);
            auVar60 = vpackssdw_avx(auVar48,auVar112);
            auVar48 = vorps_avx(auVar54,auVar122);
            auVar156._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
            auVar156._8_4_ = auVar84._8_4_;
            auVar156._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar48 = vpcmpgtq_avx(auVar156,auVar48);
            auVar48 = vpackssdw_avx(auVar48,auVar55);
            auVar48 = vblendvps_avx(auVar175._0_16_,auVar141,auVar48 ^ auVar123);
            auVar60 = vblendvps_avx(auVar175._16_16_,auVar144._16_16_,auVar60 ^ auVar123);
            auVar48 = vhaddps_avx(auVar60,auVar48);
            auVar48 = vhaddps_avx(auVar48,auVar48);
            auVar48 = vhaddps_avx(auVar48,auVar48);
            auVar145 = ZEXT1664(auVar48);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar37);
        fVar160 = auVar145._0_4_ * fVar147;
        auVar145 = ZEXT464((uint)fVar160);
        if ((int)uVar19 < 1) {
          fVar148 = 0.0;
        }
        else {
          auVar48 = vshufps_avx(ZEXT416((uint)fVar160),ZEXT416((uint)fVar160),0);
          auVar159._16_16_ = auVar48;
          auVar159._0_16_ = auVar48;
          auVar145 = ZEXT864(0);
          uVar25 = 0;
          do {
            pauVar31 = (undefined1 (*) [32])((long)pvVar1 + lVar39 * uVar25 + lVar32);
            if ((int)uVar20 < 8) {
              auVar173 = SUB6432(ZEXT864(0),0);
              uVar22 = 0;
            }
            else {
              auVar175 = ZEXT864(0);
              iVar21 = 7;
              do {
                auVar84 = vsubps_avx(*pauVar31,auVar159);
                auVar173._0_4_ = auVar175._0_4_ + auVar84._0_4_ * auVar84._0_4_;
                auVar173._4_4_ = auVar175._4_4_ + auVar84._4_4_ * auVar84._4_4_;
                auVar173._8_4_ = auVar175._8_4_ + auVar84._8_4_ * auVar84._8_4_;
                auVar173._12_4_ = auVar175._12_4_ + auVar84._12_4_ * auVar84._12_4_;
                auVar173._16_4_ = auVar175._16_4_ + auVar84._16_4_ * auVar84._16_4_;
                auVar173._20_4_ = auVar175._20_4_ + auVar84._20_4_ * auVar84._20_4_;
                auVar173._24_4_ = auVar175._24_4_ + auVar84._24_4_ * auVar84._24_4_;
                auVar173._28_4_ = auVar175._28_4_ + auVar84._28_4_;
                auVar175 = ZEXT3264(auVar173);
                pauVar31 = pauVar31 + 1;
                iVar21 = iVar21 + 8;
                uVar22 = uVar30;
              } while (iVar21 < (int)uVar20);
            }
            uVar36 = uVar22 | 3;
            auVar179 = ZEXT816(0) << 0x40;
            while( true ) {
              fVar148 = auVar179._4_4_;
              fVar161 = auVar179._8_4_;
              fVar162 = auVar179._12_4_;
              if ((int)uVar20 <= (int)uVar36) break;
              auVar60 = vsubps_avx(*(undefined1 (*) [16])*pauVar31,auVar48);
              auVar179._0_4_ = auVar179._0_4_ + auVar60._0_4_ * auVar60._0_4_;
              auVar179._4_4_ = fVar148 + auVar60._4_4_ * auVar60._4_4_;
              auVar179._8_4_ = fVar161 + auVar60._8_4_ * auVar60._8_4_;
              auVar179._12_4_ = fVar162 + auVar60._12_4_ * auVar60._12_4_;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
              uVar36 = uVar22 + 7;
              uVar22 = uVar22 + 4;
            }
            auVar69._0_4_ = auVar173._0_4_ + auVar173._16_4_;
            auVar69._4_4_ = auVar173._4_4_ + auVar173._20_4_;
            auVar69._8_4_ = auVar173._8_4_ + auVar173._24_4_;
            auVar69._12_4_ = auVar173._12_4_ + auVar173._28_4_;
            auVar60 = vshufpd_avx(auVar69,auVar69,1);
            auVar70._0_4_ = auVar60._0_4_ + auVar69._0_4_;
            auVar70._4_4_ = auVar60._4_4_ + auVar69._4_4_;
            auVar70._8_4_ = auVar60._8_4_ + auVar69._8_4_;
            auVar70._12_4_ = auVar60._12_4_ + auVar69._12_4_;
            auVar60 = vmovshdup_avx(auVar70);
            auVar54 = vshufpd_avx(auVar179,auVar179,1);
            auVar135._0_4_ = auVar179._0_4_ + auVar54._0_4_;
            auVar135._4_4_ = fVar148 + auVar54._4_4_;
            auVar135._8_4_ = fVar161 + auVar54._8_4_;
            auVar135._12_4_ = fVar162 + auVar54._12_4_;
            auVar54 = vmovshdup_avx(auVar135);
            fVar148 = auVar54._0_4_ +
                      auVar145._0_4_ + auVar60._0_4_ + auVar70._0_4_ + auVar135._0_4_;
            auVar145 = ZEXT464((uint)fVar148);
            if ((int)uVar22 < (int)uVar20) {
              uVar26 = CONCAT44(0,~uVar22 + uVar20);
              auVar71._8_8_ = 0;
              auVar71._0_8_ = uVar26;
              auVar52 = vpshufd_avx(auVar71,0x44);
              auVar60 = vorps_avx(auVar52,auVar122);
              auVar54 = vorps_avx(auVar52,auVar122);
              uVar38 = 0;
              auVar195 = ZEXT1664(CONCAT124(auVar195._4_12_,fVar148));
              do {
                auVar145 = auVar195;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar38;
                auVar53 = vpshufd_avx(auVar72,0x44);
                auVar89._16_16_ = auVar53;
                auVar89._0_16_ = auVar53;
                auVar84 = vorps_avx(auVar89,auVar15);
                auVar83 = vorps_avx(auVar89,auVar16);
                auVar53 = vorps_avx(auVar52,auVar122);
                auVar99._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
                auVar99._8_4_ = auVar83._24_4_;
                auVar99._12_4_ = auVar83._28_4_ ^ 0x80000000;
                auVar55 = vpcmpgtq_avx(auVar99,auVar53);
                auVar171._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
                auVar73._8_4_ = auVar83._8_4_;
                auVar171._8_4_ = auVar73._8_4_;
                auVar171._12_4_ = auVar83._12_4_ ^ 0x80000000;
                auVar112 = vpcmpgtq_avx(auVar171,auVar60);
                auVar112 = vpackssdw_avx(auVar112,auVar55);
                auVar116._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
                auVar116._8_4_ = auVar84._24_4_;
                auVar116._12_4_ = auVar84._28_4_ ^ 0x80000000;
                auVar129 = vpcmpgtq_avx(auVar116,auVar53);
                auVar117._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
                auVar117._8_4_ = auVar84._8_4_;
                auVar117._12_4_ = auVar84._12_4_ ^ 0x80000000;
                auVar53 = vpcmpgtq_avx(auVar117,auVar54);
                auVar53 = vpackssdw_avx(auVar53,auVar129);
                auVar53 = vpackssdw_avx(auVar53 ^ auVar123,auVar112 ^ auVar123);
                auVar112 = vpmovsxwd_avx(auVar53);
                auVar53 = vpunpckhwd_avx(auVar53,auVar53);
                auVar119._16_16_ = auVar53;
                auVar119._0_16_ = auVar112;
                auVar181 = vmaskmovps_avx(auVar119,*(undefined1 (*) [32])(*pauVar31 + uVar38 * 4));
                auVar181 = vsubps_avx(auVar181,auVar159);
                auVar172._0_4_ = auVar181._0_4_ * auVar181._0_4_ + auVar145._0_4_;
                auVar172._4_4_ = auVar181._4_4_ * auVar181._4_4_ + auVar145._4_4_;
                auVar172._8_4_ = auVar181._8_4_ * auVar181._8_4_ + auVar145._8_4_;
                auVar172._12_4_ = auVar181._12_4_ * auVar181._12_4_ + auVar145._12_4_;
                auVar174._16_4_ = auVar181._16_4_ * auVar181._16_4_ + auVar145._16_4_;
                auVar174._0_16_ = auVar172;
                auVar174._20_4_ = auVar181._20_4_ * auVar181._20_4_ + auVar145._20_4_;
                auVar174._24_4_ = auVar181._24_4_ * auVar181._24_4_ + auVar145._24_4_;
                auVar174._28_4_ = auVar181._28_4_ + auVar145._28_4_;
                uVar38 = uVar38 + 8;
                auVar195 = ZEXT3264(auVar174);
              } while ((uVar26 + 8 & 0x1fffffff8) != uVar38);
              auVar60 = vorps_avx(auVar52,auVar122);
              auVar73._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
              auVar73._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar60 = vpcmpgtq_avx(auVar73,auVar60);
              auVar54 = vpackssdw_avx(auVar60,auVar55);
              auVar60 = vorps_avx(auVar52,auVar122);
              auVar118._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
              auVar118._8_4_ = auVar84._8_4_;
              auVar118._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar60 = vpcmpgtq_avx(auVar118,auVar60);
              auVar60 = vpackssdw_avx(auVar60,auVar129);
              auVar60 = vblendvps_avx(auVar145._0_16_,auVar172,auVar60 ^ auVar123);
              auVar54 = vblendvps_avx(auVar145._16_16_,auVar174._16_16_,auVar54 ^ auVar123);
              auVar60 = vhaddps_avx(auVar54,auVar60);
              auVar60 = vhaddps_avx(auVar60,auVar60);
              auVar60 = vhaddps_avx(auVar60,auVar60);
              auVar145 = ZEXT1664(auVar60);
              auVar195 = ZEXT864(0);
            }
            fVar148 = auVar145._0_4_;
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar37);
          auVar145 = ZEXT1664(ZEXT416((uint)fVar160));
        }
      }
      if (0 < (int)uVar19) {
        auVar48 = ZEXT416((uint)(fVar148 * fVar147 + (this->super_GroupNorm).eps));
        auVar48 = vsqrtss_avx(auVar48,auVar48);
        fVar160 = 1.0 / auVar48._0_4_;
        fVar148 = fVar160 * -auVar145._0_4_;
        uVar25 = 0;
        do {
          fVar161 = fVar148;
          fVar162 = fVar160;
          if ((this->super_GroupNorm).affine != 0) {
            fVar162 = fVar160 * *pfVar28;
            fVar161 = fVar148 * *pfVar28 + *pfVar33;
          }
          pauVar31 = (undefined1 (*) [32])((long)pvVar1 + uVar17 * uVar34 * uVar25 + lVar32);
          auVar48 = vshufps_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),0);
          auVar60 = vshufps_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),0);
          fVar165 = auVar48._0_4_;
          fVar166 = auVar48._4_4_;
          fVar157 = auVar48._8_4_;
          fVar138 = auVar48._12_4_;
          fVar161 = auVar60._0_4_;
          fVar162 = auVar60._4_4_;
          fVar163 = auVar60._8_4_;
          fVar164 = auVar60._12_4_;
          uVar22 = 0;
          if (7 < (int)uVar20) {
            iVar21 = 7;
            do {
              auVar120._0_4_ = fVar165 * *(float *)*pauVar31 + fVar161;
              auVar120._4_4_ = fVar166 * *(float *)(*pauVar31 + 4) + fVar162;
              auVar120._8_4_ = fVar157 * *(float *)(*pauVar31 + 8) + fVar163;
              auVar120._12_4_ = fVar138 * *(float *)(*pauVar31 + 0xc) + fVar164;
              auVar120._16_4_ = fVar165 * *(float *)(*pauVar31 + 0x10) + fVar161;
              auVar120._20_4_ = fVar166 * *(float *)(*pauVar31 + 0x14) + fVar162;
              auVar120._24_4_ = fVar157 * *(float *)(*pauVar31 + 0x18) + fVar163;
              auVar120._28_4_ = auVar145._28_4_ + fVar164;
              auVar145 = ZEXT3264(auVar120);
              *pauVar31 = auVar120;
              pauVar31 = pauVar31 + 1;
              iVar21 = iVar21 + 8;
              uVar22 = uVar30;
            } while (iVar21 < (int)uVar20);
          }
          uVar36 = uVar22 | 3;
          while ((int)uVar36 < (int)uVar20) {
            auVar74._0_4_ = fVar161 + fVar165 * *(float *)*pauVar31;
            auVar74._4_4_ = fVar162 + fVar166 * *(float *)(*pauVar31 + 4);
            auVar74._8_4_ = fVar163 + fVar157 * *(float *)(*pauVar31 + 8);
            auVar74._12_4_ = fVar164 + fVar138 * *(float *)(*pauVar31 + 0xc);
            *(undefined1 (*) [16])*pauVar31 = auVar74;
            pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
            uVar36 = uVar22 + 7;
            uVar22 = uVar22 + 4;
          }
          if ((int)uVar22 < (int)uVar20) {
            uVar26 = CONCAT44(0,~uVar22 + uVar20);
            auVar75._8_8_ = 0;
            auVar75._0_8_ = uVar26;
            auVar54 = vpshufd_avx(auVar75,0x44);
            auVar48 = vorps_avx(auVar54,auVar122);
            auVar60 = vorps_avx(auVar54,auVar122);
            uVar38 = 0;
            do {
              auVar76._8_8_ = 0;
              auVar76._0_8_ = uVar38;
              auVar52 = vpshufd_avx(auVar76,0x44);
              auVar90._16_16_ = auVar52;
              auVar90._0_16_ = auVar52;
              auVar84 = vorps_avx(auVar90,auVar15);
              auVar83 = vorps_avx(auVar90,auVar16);
              auVar52 = vorps_avx(auVar54,auVar122);
              auVar136._0_8_ = auVar83._16_8_ ^ 0x8000000000000000;
              auVar136._8_4_ = auVar83._24_4_;
              auVar136._12_4_ = auVar83._28_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar136,auVar52);
              auVar77._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
              auVar77._8_4_ = auVar83._8_4_;
              auVar77._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar112 = vpcmpgtq_avx(auVar77,auVar48);
              auVar53 = vpackssdw_avx(auVar112,auVar53);
              auVar137._0_8_ = auVar84._16_8_ ^ 0x8000000000000000;
              auVar137._8_4_ = auVar84._24_4_;
              auVar137._12_4_ = auVar84._28_4_ ^ 0x80000000;
              auVar52 = vpcmpgtq_avx(auVar137,auVar52);
              auVar145 = ZEXT1664(auVar52);
              auVar100._0_8_ = auVar84._0_8_ ^ 0x8000000000000000;
              auVar100._8_4_ = auVar84._8_4_;
              auVar100._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar112 = vpcmpgtq_avx(auVar100,auVar60);
              auVar52 = vpackssdw_avx(auVar112,auVar52);
              auVar52 = vpackssdw_avx(auVar52 ^ auVar123,auVar53 ^ auVar123);
              auVar53 = vpmovsxwd_avx(auVar52);
              auVar52 = vpunpckhwd_avx(auVar52,auVar52);
              auVar91._16_16_ = auVar52;
              auVar91._0_16_ = auVar53;
              auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(*pauVar31 + uVar38 * 4));
              auVar107._0_4_ = fVar161 + fVar165 * auVar84._0_4_;
              auVar107._4_4_ = fVar162 + fVar166 * auVar84._4_4_;
              auVar107._8_4_ = fVar163 + fVar157 * auVar84._8_4_;
              auVar107._12_4_ = fVar164 + fVar138 * auVar84._12_4_;
              auVar107._16_4_ = fVar161 + fVar165 * auVar84._16_4_;
              auVar107._20_4_ = fVar162 + fVar166 * auVar84._20_4_;
              auVar107._24_4_ = fVar163 + fVar157 * auVar84._24_4_;
              auVar107._28_4_ = fVar164 + auVar84._28_4_;
              auVar84 = vmaskmovps_avx(auVar91,auVar107);
              *(undefined1 (*) [32])(*pauVar31 + uVar38 * 4) = auVar84;
              uVar38 = uVar38 + 8;
            } while ((uVar26 + 8 & 0x1fffffff8) != uVar38);
          }
          pfVar28 = pfVar28 + 1;
          pfVar33 = pfVar33 + 1;
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar37);
        iVar24 = (this->super_GroupNorm).group;
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < iVar24);
  }
  return 0;
}

Assistant:

int GroupNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}